

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result,
          FlatAllocator *alloc)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  string_view element_name;
  string_view element_name_00;
  string_view option_name;
  Descriptor *local_48;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
  local_40;
  
  iVar2 = (proto->field_0)._impl_.start_;
  result->start_ = iVar2;
  iVar3 = (proto->field_0)._impl_.end_;
  result->end_ = iVar3;
  result->containing_type_ = parent;
  local_48 = parent;
  if (iVar2 < 1) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
    ::try_emplace_impl<google::protobuf::Descriptor_const*const&>
              (&local_40,&this->message_hints_,&local_48);
    iVar2 = result->start_;
    iVar3 = result->end_;
    if (result->end_ < 1) {
      iVar3 = 0;
    }
    if (0x1ffffffe < iVar3) {
      iVar3 = 0x1fffffff;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (0x1ffffffe < iVar2) {
      iVar2 = 0x1fffffff;
    }
    iVar3 = iVar3 - iVar2;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar3 = iVar3 + *(int *)((long)local_40.first.field_1.slot_ + 8);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (0x1ffffffe < iVar3) {
      iVar3 = 0x1fffffff;
    }
    *(int *)((long)local_40.first.field_1.slot_ + 8) = iVar3;
    if (*(long *)((long)local_40.first.field_1.slot_ + 0x10) == 0) {
      *(ExtensionRange **)((long)local_40.first.field_1.slot_ + 0x10) = proto;
      *(undefined4 *)((long)local_40.first.field_1.slot_ + 0x18) = 1;
    }
    pcVar1 = (local_48->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name._M_str = pcVar1 + ~element_name._M_len;
    AddError(this,element_name,&proto->super_Message,NUMBER,
             "Extension numbers must be positive integers.");
    iVar2 = result->start_;
    iVar3 = result->end_;
  }
  if (iVar3 <= iVar2) {
    pcVar1 = (local_48->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name_00._M_str = pcVar1 + ~element_name_00._M_len;
    AddError(this,element_name_00,&proto->super_Message,NUMBER,
             "Extension range end number must be greater than start number.");
  }
  option_name._M_str = "google.protobuf.ExtensionRangeOptions";
  option_name._M_len = 0x25;
  AllocateOptions<google::protobuf::Descriptor::ExtensionRange>
            (this,proto,result,3,option_name,alloc);
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto, const Descriptor* parent,
    Descriptor::ExtensionRange* result, internal::FlatAllocator& alloc) {
  result->start_ = proto.start();
  result->end_ = proto.end();
  result->containing_type_ = parent;

  if (result->start_number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER, result->start_number(),
        result->end_number());
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start_number() >= result->end_number()) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }

  // Copy options
  AllocateOptions(proto, result,
                  DescriptorProto_ExtensionRange::kOptionsFieldNumber,
                  "google.protobuf.ExtensionRangeOptions", alloc);
}